

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O3

Status __thiscall leveldb::anon_unknown_1::PosixWritableFile::Sync(PosixWritableFile *this)

{
  int fd;
  _func_int **in_RAX;
  char *in_RSI;
  _Alloc_hider _Var1;
  Status status;
  _Alloc_hider local_28;
  
  local_28._M_p = (pointer)in_RAX;
  if (in_RSI[0x10014] == '\x01') {
    fd = open(*(char **)(in_RSI + 0x10038),0x80000);
    if (fd < 0) {
      __errno_location();
      PosixError((string *)&stack0xffffffffffffffd8,(int)*(undefined8 *)(in_RSI + 0x10038));
      _Var1._M_p = local_28._M_p;
    }
    else {
      SyncFd((PosixWritableFile *)&stack0xffffffffffffffd8,fd,(string *)(in_RSI + 0x10038));
      _Var1._M_p = local_28._M_p;
      close(fd);
    }
    if ((_func_int **)_Var1._M_p != (_func_int **)0x0) {
      (this->super_WritableFile)._vptr_WritableFile = (_func_int **)_Var1._M_p;
      return (Status)(char *)this;
    }
  }
  WriteUnbuffered((PosixWritableFile *)&stack0xffffffffffffffd8,in_RSI,(size_t)(in_RSI + 8));
  in_RSI[0x10008] = '\0';
  in_RSI[0x10009] = '\0';
  in_RSI[0x1000a] = '\0';
  in_RSI[0x1000b] = '\0';
  in_RSI[0x1000c] = '\0';
  in_RSI[0x1000d] = '\0';
  in_RSI[0x1000e] = '\0';
  in_RSI[0x1000f] = '\0';
  if ((_func_int **)local_28._M_p == (_func_int **)0x0) {
    SyncFd(this,*(int *)(in_RSI + 0x10010),(string *)(in_RSI + 0x10018));
  }
  else {
    (this->super_WritableFile)._vptr_WritableFile = (_func_int **)local_28._M_p;
  }
  return (Status)(char *)this;
}

Assistant:

Status Sync() override {
    // Ensure new files referred to by the manifest are in the filesystem.
    //
    // This needs to happen before the manifest file is flushed to disk, to
    // avoid crashing in a state where the manifest refers to files that are not
    // yet on disk.
    Status status = SyncDirIfManifest();
    if (!status.ok()) {
      return status;
    }

    status = FlushBuffer();
    if (!status.ok()) {
      return status;
    }

    return SyncFd(fd_, filename_);
  }